

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

bool __thiscall QDomNodeListPrivate::checkNode(QDomNodeListPrivate *this,QDomNodePrivate *p)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (p == (QDomNodePrivate *)0x0) {
LAB_0010d408:
    bVar1 = false;
  }
  else {
    iVar2 = (*p->_vptr_QDomNodePrivate[0xb])(p);
    if (iVar2 != 1) goto LAB_0010d408;
    if ((this->nsURI).d.ptr != (char16_t *)0x0) {
      bVar1 = comparesEqual(&p->name,&this->tagname);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          bVar1 = comparesEqual(&p->namespaceURI,&this->nsURI);
          return bVar1;
        }
        goto LAB_0010d467;
      }
      goto LAB_0010d408;
    }
    local_30.d = (p->name).d.d;
    local_30.ptr = (p->name).d.ptr;
    local_30.size = (p->name).d.size;
    if (local_30.d != (Data *)0x0) {
      LOCK();
      ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar1 = comparesEqual((QString *)&local_30,&this->tagname);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
LAB_0010d467:
  __stack_chk_fail();
}

Assistant:

bool QDomNodeListPrivate::checkNode(QDomNodePrivate *p) const
{
    return p && p->isElement() && (nsURI.isNull()
                                   ? p->nodeName() == tagname
                                   : p->name == tagname && p->namespaceURI == nsURI);
}